

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_on_write.h
# Opt level: O1

copy_on_write<DerivedType> *
make_copy_on_write<DerivedType,int&>(copy_on_write<DerivedType> *__return_storage_ptr__,int *ts)

{
  int iVar1;
  undefined4 extraout_var;
  copy_on_write<DerivedType> p;
  
  p.ptr_ = (DerivedType *)0x0;
  p.cb_.super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p.cb_.super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (p.cb_.super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base =
       (_func_int **)&PTR__direct_shared_control_block_0018f3b0;
  iVar1 = *ts;
  *(undefined ***)
   &(p.cb_.super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_M_use_count = &PTR_value_0018f1f0;
  DerivedType::object_count = DerivedType::object_count + 1;
  *(int *)&p.cb_.super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi[1]._vptr__Sp_counted_base = iVar1;
  std::__shared_ptr<shared_control_block<DerivedType>,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<shared_control_block<DerivedType>,(__gnu_cxx::_Lock_policy)2> *)&p,
             (unique_ptr<direct_shared_control_block<DerivedType,_DerivedType>,_std::default_delete<direct_shared_control_block<DerivedType,_DerivedType>_>_>
              *)&p.cb_.
                 super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
  if (p.cb_.super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(p.cb_.super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_vptr__Sp_counted_base[1])();
  }
  iVar1 = (*((p.ptr_)->super_BaseType)._vptr_BaseType[3])();
  __return_storage_ptr__->ptr_ = (DerivedType *)CONCAT44(extraout_var,iVar1);
  (__return_storage_ptr__->cb_).
  super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)p.ptr_;
  (__return_storage_ptr__->cb_).
  super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->cb_).
  super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          p.cb_.super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr;
  return __return_storage_ptr__;
}

Assistant:

copy_on_write<T> make_copy_on_write(Ts&&... ts)
{
  copy_on_write<T> p;
  p.cb_ = std::make_unique<direct_shared_control_block<T>>(std::forward<Ts>(ts)...);
  p.ptr_ = p.cb_->ptr();
  return std::move(p);
}